

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test::TestBody
          (ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test *this)

{
  undefined8 in_RDI;
  ktx_uint32_t unaff_retaddr;
  ktx_uint32_t unaff_retaddr_00;
  ktx_uint32_t in_stack_00000008;
  createFlags in_stack_0000000c;
  TextureWriterTestHelper<unsigned_short,_2U,_33324U> *in_stack_00000010;
  ktx_uint32_t in_stack_00000028;
  undefined1 in_stack_000003ae;
  undefined1 in_stack_000003af;
  ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U> *in_stack_000003b0;
  
  TextureWriterTestHelper<unsigned_short,_2U,_33324U>::resize
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             (ktx_uint32_t)((ulong)in_RDI >> 0x20),(ktx_uint32_t)this,in_stack_00000028);
  ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>::runTest
            (in_stack_000003b0,(bool)in_stack_000003af,(bool)in_stack_000003ae);
  return;
}

Assistant:

TEST_F(ktxTexture1WriteKTX2TestRG16, Write2DMipmap) {
    helper.resize(createFlagBits::eMipmapped, 1, 1, 2, 32, 32, 1);
    runTest(true);
}